

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int checkColumnOverlap(IdList *pIdList,ExprList *pEList)

{
  int iVar1;
  IdList *in_RSI;
  long in_RDI;
  int e;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  int local_4;
  
  if ((in_RDI == 0) || (in_RSI == (IdList *)0x0)) {
    local_4 = 1;
  }
  else {
    for (iVar2 = 0; iVar2 < in_RSI->nId; iVar2 = iVar2 + 1) {
      iVar1 = sqlite3IdListIndex(in_RSI,(char *)CONCAT44(iVar2,in_stack_ffffffffffffffe0));
      if (-1 < iVar1) {
        return 1;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int checkColumnOverlap(IdList *pIdList, ExprList *pEList){
  int e;
  if( pIdList==0 || NEVER(pEList==0) ) return 1;
  for(e=0; e<pEList->nExpr; e++){
    if( sqlite3IdListIndex(pIdList, pEList->a[e].zEName)>=0 ) return 1;
  }
  return 0;
}